

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780Analyzer.cpp
# Opt level: O1

bool __thiscall
HD44780Analyzer::GetOperation
          (HD44780Analyzer *this,bool *ARS,bool *ARW,U8 *AData,S64 *AEStart,S64 *AEEnd,
          bool ASecondNibble)

{
  HD44780AnalyzerSettings *pHVar1;
  AnalyzerChannelData *pAVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  AnalyzerChannelData **ppAVar8;
  double dVar9;
  Channel local_90 [16];
  Channel local_80 [16];
  Channel local_70 [16];
  Channel local_60 [16];
  Channel local_50 [16];
  Channel local_40 [16];
  
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar4 = AnalyzerChannelData::GetSampleNumber();
  *AEStart = lVar4;
  pHVar1 = (this->mSettings)._M_ptr;
  if (((pHVar1->mMarkTimingErrors == true) && (this->mLastEStart != 0)) &&
     (dVar9 = (double)this->mSampleRateHz * ((double)pHVar1->mEnableCycleMin / 1000000000.0),
     uVar7 = (ulong)dVar9,
     lVar4 - this->mLastEStart < (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9))
     )) {
    AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,(MarkerType)lVar4,(Channel *)0x6);
  }
  this->mLastEStart = *AEStart;
  if (!ASecondNibble) {
    dVar9 = (double)this->mSampleRateHz *
            ((double)((this->mSettings)._M_ptr)->mAddressSetupMin / 1000000000.0);
    uVar7 = (ulong)dVar9;
    uVar7 = (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9));
    lVar4 = *AEStart;
    if ((long)uVar7 < lVar4) {
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      if (lVar5 < (long)(lVar4 - uVar7)) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mRS);
      }
      if (this->mRW != (AnalyzerChannelData *)0x0) {
        lVar4 = *AEStart;
        lVar5 = AnalyzerChannelData::GetSampleNumber();
        if (lVar5 < (long)(lVar4 - uVar7)) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mRW);
        }
      }
    }
  }
  pAVar2 = this->mRS;
  Channel::Channel(local_60,&((this->mSettings)._M_ptr)->mRSChannel);
  AdvanceToAbsPositionWhileMarking(this,pAVar2,local_60,*AEStart);
  Channel::~Channel(local_60);
  pAVar2 = this->mRW;
  if (pAVar2 != (AnalyzerChannelData *)0x0) {
    Channel::Channel(local_70,&((this->mSettings)._M_ptr)->mRWChannel);
    AdvanceToAbsPositionWhileMarking(this,pAVar2,local_70,*AEStart);
    Channel::~Channel(local_70);
  }
  iVar3 = AnalyzerChannelData::GetBitState();
  *ARS = iVar3 == 1;
  if (!ASecondNibble) {
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,(MarkerType)*AEStart,(Channel *)0x0);
  }
  if (this->mRW == (AnalyzerChannelData *)0x0) {
    *ARW = false;
  }
  else {
    iVar3 = AnalyzerChannelData::GetBitState();
    *ARW = iVar3 == 1;
    if (!ASecondNibble) {
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)*AEStart,(Channel *)0x0);
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar4 = AnalyzerChannelData::GetSampleNumber();
  *AEEnd = lVar4;
  pHVar1 = (this->mSettings)._M_ptr;
  if ((pHVar1->mMarkTimingErrors == true) &&
     (dVar9 = (double)this->mSampleRateHz * ((double)pHVar1->mEnablePulseWidthMin / 1000000000.0),
     uVar7 = (ulong)dVar9,
     lVar4 - *AEStart < (long)(ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9))))
  {
    AnalyzerResults::AddMarker((ulonglong)(this->mResults)._M_ptr,(MarkerType)lVar4,(Channel *)0x6);
  }
  pHVar1 = (this->mSettings)._M_ptr;
  if (*ARW == true) {
    dVar9 = ((double)pHVar1->mDataReadDelayMax / 1000000000.0) * (double)this->mSampleRateHz;
    uVar7 = (ulong)dVar9;
    uVar7 = (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9)) + *AEStart;
  }
  else {
    dVar9 = ((double)pHVar1->mDataWriteSetupMin / 1000000000.0) * (double)this->mSampleRateHz;
    uVar7 = (ulong)dVar9;
    uVar7 = *AEEnd - (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9));
  }
  ppAVar8 = this->mDB;
  lVar4 = 0x40;
  do {
    if (*ppAVar8 != (AnalyzerChannelData *)0x0) {
      uVar6 = AnalyzerChannelData::GetSampleNumber();
      if (uVar6 < uVar7) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)*ppAVar8);
      }
      pAVar2 = *ppAVar8;
      Channel::Channel(local_40,(Channel *)
                                (&((this->mSettings)._M_ptr)->super_AnalyzerSettings + lVar4));
      AdvanceToAbsPositionWhileMarking(this,pAVar2,local_40,*AEEnd);
      Channel::~Channel(local_40);
    }
    ppAVar8 = ppAVar8 + 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0xc0);
  *AData = '\0';
  lVar4 = 0;
  do {
    if (this->mDB[lVar4] != (AnalyzerChannelData *)0x0) {
      iVar3 = AnalyzerChannelData::GetBitState();
      if (iVar3 == 1) {
        *AData = *AData | (byte)(1 << ((byte)lVar4 & 0x1f));
      }
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)*AEEnd,(Channel *)0x0);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  pAVar2 = this->mRS;
  Channel::Channel(local_80,&((this->mSettings)._M_ptr)->mRSChannel);
  dVar9 = (double)this->mSampleRateHz *
          ((double)((this->mSettings)._M_ptr)->mAddressHoldMin / 1000000000.0);
  uVar7 = (ulong)dVar9;
  AdvanceToAbsPositionWhileMarking
            (this,pAVar2,local_80,
             (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9)) + *AEEnd);
  Channel::~Channel(local_80);
  pAVar2 = this->mRW;
  if (pAVar2 != (AnalyzerChannelData *)0x0) {
    Channel::Channel(local_90,&((this->mSettings)._M_ptr)->mRWChannel);
    dVar9 = (double)this->mSampleRateHz *
            ((double)((this->mSettings)._M_ptr)->mAddressHoldMin / 1000000000.0);
    uVar7 = (ulong)dVar9;
    AdvanceToAbsPositionWhileMarking
              (this,pAVar2,local_90,
               (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9)) + *AEEnd);
    Channel::~Channel(local_90);
  }
  dVar9 = ((double)*(uint *)&((this->mSettings)._M_ptr)->mDBChannelInterface[(ulong)*ARW - 6]._M_ptr
          / 1000000000.0) * (double)this->mSampleRateHz;
  uVar7 = (ulong)dVar9;
  lVar4 = *AEEnd;
  ppAVar8 = this->mDB;
  lVar5 = 0x40;
  do {
    pAVar2 = *ppAVar8;
    if (pAVar2 != (AnalyzerChannelData *)0x0) {
      Channel::Channel(local_50,(Channel *)
                                (&((this->mSettings)._M_ptr)->super_AnalyzerSettings + lVar5));
      AdvanceToAbsPositionWhileMarking
                (this,pAVar2,local_50,
                 (ulong)((int)uVar7 + (uint)((double)(uVar7 & 0xffffffff) != dVar9)) + lVar4);
      Channel::~Channel(local_50);
    }
    ppAVar8 = ppAVar8 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0xc0);
  return true;
}

Assistant:

bool HD44780Analyzer::GetOperation( bool& ARS, bool& ARW, U8& AData, S64& AEStart, S64& AEEnd, bool ASecondNibble )
{
    U64 pos;
    U32 dbline, ui1;

    // move to the E high transition
    mE->AdvanceToNextEdge();
    AEStart = mE->GetSampleNumber();

    // check between E high transitions for >= mEnableCycleMin
    if( mSettings->mMarkTimingErrors && mLastEStart && AEStart - mLastEStart < TimeToSamplesOrMore( mSettings->mEnableCycleMin / _NS ) )
        mResults->AddMarker( AEStart, AnalyzerResults::X, mSettings->mEChannel );
    mLastEStart = AEStart;

    // advance rs/rw to the e position less mAddressSetupMin if in 8 bit mode or if in the first nibble of 4 bit mode
    if( !ASecondNibble )
    {
        ui1 = TimeToSamplesOrMore( mSettings->mAddressSetupMin / _NS );
        if( AEStart > ui1 )
        {
            if( AEStart - ui1 > ( S64 )mRS->GetSampleNumber() )
                mRS->AdvanceToAbsPosition( AEStart - ui1 );
            if( mRW != NULL && AEStart - ui1 > ( S64 )mRW->GetSampleNumber() ) // mRW is optional
                mRW->AdvanceToAbsPosition( AEStart - ui1 );
        }
    }

    // advance rs/rw to the estart position while marking any changes
    AdvanceToAbsPositionWhileMarking( mRS, mSettings->mRSChannel, AEStart );
    if( mRW != NULL ) // mRW is optional
        AdvanceToAbsPositionWhileMarking( mRW, mSettings->mRWChannel, AEStart );

    // sample rs/rw
    ARS = ( mRS->GetBitState() == BIT_HIGH ) ? true : false;
    if( !ASecondNibble ) // do not mark second nibble rs/rw
        mResults->AddMarker( AEStart, AnalyzerResults::Dot, mSettings->mRSChannel );
    if( mRW != NULL ) // mRW is optional
    {
        ARW = ( mRW->GetBitState() == BIT_HIGH ) ? true : false;
        if( !ASecondNibble ) // do not mark second nibble rs/rw
            mResults->AddMarker( AEStart, AnalyzerResults::Dot, mSettings->mRWChannel );
    }
    else
        ARW = false; // if RW not present we assume it is ground (write)

    // move to the E low transition
    mE->AdvanceToNextEdge();
    AEEnd = mE->GetSampleNumber();

    // check E pulse width for >= mEnablePulseWidthMin
    if( mSettings->mMarkTimingErrors && AEEnd - AEStart < TimeToSamplesOrMore( mSettings->mEnablePulseWidthMin / _NS ) )
        mResults->AddMarker( AEEnd, AnalyzerResults::X, mSettings->mEChannel );

    // determine position to advance dbX and advance dbX based on read/write
    // advance dbX to the eend position while marking any changes
    if( ARW )
        pos = AEStart + TimeToSamplesOrMore( mSettings->mDataReadDelayMax / _NS );
    else
        pos = AEEnd - TimeToSamplesOrMore( mSettings->mDataWriteSetupMin / _NS );
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
        {
            if( pos > mDB[ dbline ]->GetSampleNumber() )
                mDB[ dbline ]->AdvanceToAbsPosition( pos );
            AdvanceToAbsPositionWhileMarking( mDB[ dbline ], mSettings->mDBChannel[ dbline ], AEEnd );
        }

    // sample dbX
    AData = 0;
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
        {
            if( mDB[ dbline ]->GetBitState() == BIT_HIGH )
                AData |= ( 1 << dbline );
            mResults->AddMarker( AEEnd, AnalyzerResults::Dot, mSettings->mDBChannel[ dbline ] );
        }

    // advance rs/rw to the eend+mAddressHoldMin while marking any changes
    AdvanceToAbsPositionWhileMarking( mRS, mSettings->mRSChannel, AEEnd + TimeToSamplesOrMore( mSettings->mAddressHoldMin / _NS ) );
    if( mRW != NULL ) // mRW is optional
        AdvanceToAbsPositionWhileMarking( mRW, mSettings->mRWChannel, AEEnd + TimeToSamplesOrMore( mSettings->mAddressHoldMin / _NS ) );

    // advance dbX to the eend+mDataReadHoldMin (read) or eend+mDataWriteHoldMin (write)
    if( ARW )
        pos = AEEnd + TimeToSamplesOrMore( mSettings->mDataReadHoldMin / _NS );
    else
        pos = AEEnd + TimeToSamplesOrMore( mSettings->mDataWriteHoldMin / _NS );
    for( dbline = 0; dbline < 8; dbline++ )
        if( mDB[ dbline ] != NULL ) // some channels are optional
            AdvanceToAbsPositionWhileMarking( mDB[ dbline ], mSettings->mDBChannel[ dbline ], pos );

    return true;
}